

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::replaceStreamData
          (QPDFObjectHandle *this,string *data,QPDFObjectHandle *filter,
          QPDFObjectHandle *decode_parms)

{
  element_type *this_00;
  uchar *__dest;
  void *__src;
  size_t __n;
  shared_ptr<Buffer> local_78;
  QPDFObjectHandle local_68 [2];
  uchar *local_48;
  uchar *bp;
  undefined1 local_38 [8];
  shared_ptr<Buffer> b;
  QPDFObjectHandle *decode_parms_local;
  QPDFObjectHandle *filter_local;
  string *data_local;
  QPDFObjectHandle *this_local;
  
  b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)decode_parms;
  bp = (uchar *)std::__cxx11::string::length();
  std::make_shared<Buffer,unsigned_long>((unsigned_long *)local_38);
  this_00 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_38);
  __dest = Buffer::getBuffer(this_00);
  local_48 = __dest;
  if (__dest != (uchar *)0x0) {
    __src = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::length();
    memcpy(__dest,__src,__n);
  }
  as_stream(local_68,(typed)this);
  std::shared_ptr<Buffer>::shared_ptr(&local_78,(shared_ptr<Buffer> *)local_38);
  ::qpdf::Stream::replaceStreamData
            ((Stream *)local_68,&local_78,filter,
             (QPDFObjectHandle *)
             b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  std::shared_ptr<Buffer>::~shared_ptr(&local_78);
  ::qpdf::Stream::~Stream((Stream *)local_68);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::replaceStreamData(
    std::string const& data, QPDFObjectHandle const& filter, QPDFObjectHandle const& decode_parms)
{
    auto b = std::make_shared<Buffer>(data.length());
    unsigned char* bp = b->getBuffer();
    if (bp) {
        memcpy(bp, data.c_str(), data.length());
    }
    as_stream(error).replaceStreamData(b, filter, decode_parms);
}